

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

void dungeon_change_level(player *p,wchar_t dlev)

{
  player_upkeep *ppVar1;
  
  p->depth = (int16_t)dlev;
  if ((dlev == L'\0') && (daycount != 0)) {
    store_update();
  }
  ppVar1 = p->upkeep;
  ppVar1->autosave = true;
  ppVar1->generate_level = true;
  return;
}

Assistant:

void dungeon_change_level(struct player *p, int dlev)
{
	/* New depth */
	p->depth = dlev;

	/* If we're returning to town, update the store contents
	   according to how long we've been away */
	if (!dlev && daycount)
		store_update();

	/* Leaving, make new level */
	p->upkeep->generate_level = true;

	/* Save the game when we arrive on the new level. */
	p->upkeep->autosave = true;
}